

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilTransferNodeOne
               (Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords,int nOffset,int fShift)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int local_3c;
  int fComp1;
  int k;
  uint *pSimmNode1;
  uint *pSimmNode;
  int fShift_local;
  int nOffset_local;
  int nSimWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsCo(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsCo(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simUtils.c"
                  ,0x15a,"void Sim_UtilTransferNodeOne(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
  }
  pvVar2 = Vec_PtrEntry(vSimInfo,pNode->Id);
  iVar1 = Abc_ObjFaninId0(pNode);
  pvVar3 = Vec_PtrEntry(vSimInfo,iVar1);
  iVar4 = nOffset + (uint)(0 < fShift) * nSimWords;
  iVar1 = Abc_ObjFaninC0(pNode);
  if (iVar1 == 0) {
    for (local_3c = 0; local_3c < nSimWords; local_3c = local_3c + 1) {
      *(undefined4 *)((long)pvVar2 + (long)local_3c * 4 + (long)iVar4 * 4) =
           *(undefined4 *)((long)pvVar3 + (long)local_3c * 4 + (long)nOffset * 4);
    }
  }
  else {
    for (local_3c = 0; local_3c < nSimWords; local_3c = local_3c + 1) {
      *(uint *)((long)pvVar2 + (long)local_3c * 4 + (long)iVar4 * 4) =
           *(uint *)((long)pvVar3 + (long)local_3c * 4 + (long)nOffset * 4) ^ 0xffffffff;
    }
  }
  return;
}

Assistant:

void Sim_UtilTransferNodeOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords, int nOffset, int fShift )
{
    unsigned * pSimmNode, * pSimmNode1;
    int k, fComp1;
    // simulate the internal nodes
    assert( Abc_ObjIsCo(pNode) );
    pSimmNode  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pSimmNode1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pSimmNode  += nOffset + (fShift > 0)*nSimWords;
    pSimmNode1 += nOffset;
    fComp1 = Abc_ObjFaninC0(pNode);
    if ( fComp1 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k];
    else 
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k];
}